

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<ot::commissioner::Error_(ot::commissioner::JoinerType,_unsigned_long)>
::Matches(OnCallSpec<ot::commissioner::Error_(ot::commissioner::JoinerType,_unsigned_long)> *this,
         ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<ot::commissioner::JoinerType>,testing::Matcher<unsigned_long>>,std::tuple<ot::commissioner::JoinerType,unsigned_long>>
                    ((tuple<testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_long>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<ot::commissioner::JoinerType,_unsigned_long>_&>::Matches
                      ((MatcherBase<const_std::tuple<ot::commissioner::JoinerType,_unsigned_long>_&>
                        *)(this + 0x40),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }